

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.hpp
# Opt level: O0

int8_t __thiscall
scp::BigInt<unsigned_int,_unsigned_long>::compare
          (BigInt<unsigned_int,_unsigned_long> *this,BigInt<unsigned_int,_unsigned_long> *x)

{
  size_type sVar1;
  size_type sVar2;
  uint *puVar3;
  uint *itXEnd;
  uint *itX;
  uint *it;
  BigInt<unsigned_int,_unsigned_long> *x_local;
  BigInt<unsigned_int,_unsigned_long> *this_local;
  
  if (((this->_positive & 1U) == 0) || ((x->_positive & 1U) != 0)) {
    if (((this->_positive & 1U) == 0) && ((x->_positive & 1U) != 0)) {
      this_local._7_1_ = -1;
    }
    else {
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_values);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&x->_values);
      if (sVar2 < sVar1) {
        if ((this->_positive & 1U) == 0) {
          this_local._7_1_ = -1;
        }
        else {
          this_local._7_1_ = '\x01';
        }
      }
      else {
        sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_values);
        sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&x->_values);
        if (sVar1 < sVar2) {
          if ((this->_positive & 1U) == 0) {
            this_local._7_1_ = '\x01';
          }
          else {
            this_local._7_1_ = -1;
          }
        }
        else {
          puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&this->_values);
          sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->_values);
          itX = puVar3 + sVar1;
          puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&x->_values);
          sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&x->_values);
          itXEnd = puVar3 + sVar1;
          puVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data(&x->_values);
          do {
            itX = itX + -1;
            itXEnd = itXEnd + -1;
            if (itXEnd == puVar3 + -1) {
              return '\0';
            }
          } while (*itX == *itXEnd);
          if (*itXEnd < *itX) {
            this_local._7_1_ = '\x01';
          }
          else {
            this_local._7_1_ = -1;
          }
        }
      }
    }
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

constexpr int8_t BigInt<TBase, TBuffer>::compare(const BigInt<TBase, TBuffer>& x) const
	{
		if (_positive && !x._positive)
		{
			return 1;
		}

		if (!_positive && x._positive)
		{
			return -1;
		}

		if (_values.size() > x._values.size())
		{
			if (_positive)
			{
				return 1;
			}

			return -1;
		}

		if (_values.size() < x._values.size())
		{
			if (_positive)
			{
				return -1;
			}

			return 1;
		}

		const TBase* it = _values.data() + _values.size() - 1;
		const TBase* itX = x._values.data() + x._values.size() - 1;
		const TBase* const itXEnd = x._values.data() - 1;
		while (itX != itXEnd)
		{
			if (*it != *itX)
			{
				if (*it > *itX)
				{
					return 1;
				}

				return -1;
			}

			--it;
			--itX;
		}

		return 0;
	}